

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMate.cpp
# Opt level: O1

void __thiscall chrono::ChLinkMateGeneric::SetupLinkMask(ChLinkMateGeneric *this)

{
  uint newnconstr;
  
  newnconstr = (uint)this->c_rz + (uint)this->c_ry +
               (uint)this->c_rx + (uint)this->c_z + (uint)this->c_y + (uint)this->c_x;
  ChLinkMask::ResetNconstr(&this->mask,newnconstr);
  (this->C).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_6,_1>_>.m_storage.m_rows =
       (ulong)newnconstr;
  if (newnconstr != 0) {
    memset(&this->C,0,(ulong)(newnconstr * 8));
  }
  ChangedLinkMask(this);
  return;
}

Assistant:

void ChLinkMateGeneric::SetupLinkMask() {
    int nc = 0;
    if (c_x)
        nc++;
    if (c_y)
        nc++;
    if (c_z)
        nc++;
    if (c_rx)
        nc++;
    if (c_ry)
        nc++;
    if (c_rz)
        nc++;

    mask.ResetNconstr(nc);

    C.setZero(nc);

    ChangedLinkMask();
}